

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O0

hrgls_Message __thiscall hrgls::Message::RawMessage(Message *this)

{
  hrgls_Message ret;
  Message *this_local;
  
  if (this->m_private == (Message_private *)0x0) {
    this_local = (Message *)0x0;
  }
  else if (this->m_private->Message == (hrgls_Message)0x0) {
    this->m_private->status = 0x3ee;
    this_local = (Message *)0x0;
  }
  else {
    this->m_private->status = 0;
    this_local = (Message *)this->m_private->Message;
  }
  return (hrgls_Message)this_local;
}

Assistant:

hrgls_Message const Message::RawMessage() const
  {
    hrgls_Message ret = nullptr;
    if (!m_private) {
      return ret;
    }
    if (!m_private->Message) {
      m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
      return ret;
    }
    m_private->status = hrgls_STATUS_OKAY;
    return m_private->Message;
  }